

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.c
# Opt level: O0

void abuf_template_init_ext
               (abuf_template_storage *storage,abuf_template_data *data,size_t data_count,
               char *format)

{
  bool bVar1;
  bool bVar2;
  abuf_template_data_entry *paVar3;
  ulong local_58;
  size_t j;
  size_t i;
  size_t pos;
  size_t start;
  _Bool escape;
  _Bool no_open_format;
  abuf_template_data_entry *d;
  char *format_local;
  size_t data_count_local;
  abuf_template_data *data_local;
  abuf_template_storage *storage_local;
  
  bVar1 = true;
  bVar2 = false;
  pos = 0;
  i = 0;
  memset(storage,0,0x610);
  if (format == (char *)0x0) {
    storage->format = "\t";
    storage->count = 0;
    for (local_58 = 0; local_58 < data_count; local_58 = local_58 + 1) {
      for (j = 0; j < data[local_58].count; j = j + 1) {
        storage->indices[storage->count].start = 1;
        storage->indices[storage->count].end = 0;
        storage->indices[storage->count].data = data[local_58].data + j;
        storage->count = storage->count + 1;
      }
    }
    if (storage->count != 0) {
      storage->indices[0].start = 0;
      storage->indices[storage->count - 1].end = 1;
    }
  }
  else {
    storage->format = format;
    while (format[i] != '\0') {
      if ((bVar2) || (format[i] != '%')) {
        if (format[i] == '\\') {
          bVar2 = (bool)(bVar2 ^ 1);
        }
        else {
          bVar2 = false;
        }
LAB_0010e8b3:
        i = i + 1;
      }
      else {
        if (!bVar1) {
          if ((1 < i - pos) &&
             (paVar3 = _find_template(data,data_count,format + pos + 1,(i - pos) - 1),
             paVar3 != (abuf_template_data_entry *)0x0)) {
            storage->indices[storage->count].start = pos;
            storage->indices[storage->count].end = i + 1;
            storage->indices[storage->count].data = paVar3;
            storage->count = storage->count + 1;
          }
          bVar1 = true;
          goto LAB_0010e8b3;
        }
        pos = i;
        i = i + 1;
        bVar1 = false;
      }
    }
  }
  return;
}

Assistant:

void
abuf_template_init_ext(
  struct abuf_template_storage *storage, struct abuf_template_data *data, size_t data_count, const char *format) {
  /* helper string for 'just one tab between keys' */
  static const char default_format[] = "\t";

  struct abuf_template_data_entry *d;
  bool no_open_format = true;
  bool escape = false;
  size_t start = 0;
  size_t pos = 0;
  size_t i, j;

  memset(storage, 0, sizeof(*storage));

  if (!format) {
    /* generate default format, just tab between each value */
    storage->format = default_format;

    storage->count = 0;

    for (j = 0; j < data_count; j++) {
      for (i = 0; i < data[j].count; i++) {
        storage->indices[storage->count].start = 1;
        storage->indices[storage->count].end = 0;
        storage->indices[storage->count].data = &data[j].data[i];
        storage->count++;
      }
    }

    if (storage->count) {
      storage->indices[0].start = 0;
      storage->indices[storage->count - 1].end = 1;
    }
    return;
  }

  storage->format = format;
  while (format[pos]) {
    if (!escape && format[pos] == '%') {
      if (no_open_format) {
        start = pos++;
        no_open_format = false;
        continue;
      }
      if (pos - start > 1) {
        d = _find_template(data, data_count, &format[start + 1], pos - start - 1);
        if (d) {
          storage->indices[storage->count].start = start;
          storage->indices[storage->count].end = pos + 1;
          storage->indices[storage->count].data = d;

          storage->count++;
        }
      }
      no_open_format = true;
    }
    else if (format[pos] == '\\') {
      /* handle "\\" and "\%" in text */
      escape = !escape;
    }
    else {
      escape = false;
    }

    pos++;
  }
}